

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::coap::Coap::SendEmptyChanged
          (Error *__return_storage_ptr__,Coap *this,Request *aRequest)

{
  char *pcVar1;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *begin;
  char *from;
  bool bVar2;
  format_args args;
  writer write;
  writer local_90;
  string local_88;
  format_string_checker<char> local_68;
  
  if ((undefined1  [12])((undefined1  [12])aRequest->mHeader & (undefined1  [12])0xc) ==
      (undefined1  [12])0x0) {
    SendHeaderResponse(__return_storage_ptr__,this,kChanged,aRequest);
  }
  else {
    local_68.types_[0] = none_type;
    from = "the CoAP request is not Confirmable";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "the CoAP request is not Confirmable";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x23;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    local_90.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      if (from == "") break;
      to = from;
      if (*from == '{') {
LAB_001d50ba:
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_90,from,to);
        from = fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (to,"",&local_68);
        bVar2 = true;
      }
      else {
        to = from + 1;
        bVar2 = to != "";
        if (bVar2) {
          if (*to != '{') {
            pcVar1 = from + 2;
            do {
              to = pcVar1;
              bVar2 = to != "";
              if (to == "") goto LAB_001d50b6;
              pcVar1 = to + 1;
            } while (*to != '{');
          }
          bVar2 = true;
        }
LAB_001d50b6:
        if (bVar2) goto LAB_001d50ba;
        fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&local_90,from,"");
        bVar2 = false;
      }
    } while (bVar2);
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    fmt::v10::vformat_abi_cxx11_
              (&local_88,(v10 *)"the CoAP request is not Confirmable",(string_view)ZEXT816(0x23),
               args);
    __return_storage_ptr__->mCode = kInvalidArgs;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->mMessage,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error Coap::SendEmptyChanged(const Request &aRequest)
{
    if (!aRequest.IsConfirmable())
    {
        return ERROR_INVALID_ARGS("the CoAP request is not Confirmable");
    }
    return SendHeaderResponse(Code::kChanged, aRequest);
}